

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O0

quint32 __thiscall QHostAddress::toIPv4Address(QHostAddress *this,bool *ok)

{
  long lVar1;
  QHostAddressPrivate *pQVar2;
  long in_RSI;
  quint32 *in_RDI;
  long in_FS_OFFSET;
  QFlagsStorage<QHostAddress::ConversionModeFlag> unaff_retaddr;
  quint32 dummy;
  undefined6 in_stack_ffffffffffffffc8;
  undefined1 uVar3;
  undefined1 uVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI != 0) {
    pQVar2 = QExplicitlySharedDataPointer<QHostAddressPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)0x216838);
    uVar3 = true;
    if (pQVar2->protocol != '\0') {
      pQVar2 = QExplicitlySharedDataPointer<QHostAddressPrivate>::operator->
                         ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)0x216851);
      uVar4 = true;
      uVar3 = uVar4;
      if (pQVar2->protocol != '\x02') {
        pQVar2 = QExplicitlySharedDataPointer<QHostAddressPrivate>::operator->
                           ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)0x21686a);
        uVar3 = false;
        if (pQVar2->protocol == '\x01') {
          pQVar2 = QExplicitlySharedDataPointer<QHostAddressPrivate>::operator->
                             ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)0x216883);
          ::operator|((enum_type)((ulong)&pQVar2->field_1 >> 0x20),(enum_type)&pQVar2->field_1);
          uVar3 = convertToIpv4(in_RDI,(Q_IPV6ADDR *)
                                       CONCAT17(uVar4,CONCAT16(uVar3,in_stack_ffffffffffffffc8)),
                                (ConversionMode)unaff_retaddr.i);
        }
      }
    }
    *(undefined1 *)in_RSI = uVar3;
  }
  pQVar2 = QExplicitlySharedDataPointer<QHostAddressPrivate>::operator->
                     ((QExplicitlySharedDataPointer<QHostAddressPrivate> *)0x2168d6);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return pQVar2->a;
}

Assistant:

quint32 QHostAddress::toIPv4Address(bool *ok) const
{
    quint32 dummy;
    if (ok)
        *ok = d->protocol == QHostAddress::IPv4Protocol || d->protocol == QHostAddress::AnyIPProtocol
              || (d->protocol == QHostAddress::IPv6Protocol
                  && convertToIpv4(dummy, d->a6, ConversionMode(QHostAddress::ConvertV4MappedToIPv4
                                                                | QHostAddress::ConvertUnspecifiedAddress)));
    return d->a;
}